

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall
leveldb::log::LogTest_RandomRead_Test::~LogTest_RandomRead_Test(LogTest_RandomRead_Test *this)

{
  LogTest::~LogTest(&this->super_LogTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, RandomRead) {
  const int N = 500;
  Random write_rnd(301);
  for (int i = 0; i < N; i++) {
    Write(RandomSkewedString(i, &write_rnd));
  }
  Random read_rnd(301);
  for (int i = 0; i < N; i++) {
    ASSERT_EQ(RandomSkewedString(i, &read_rnd), Read());
  }
  ASSERT_EQ("EOF", Read());
}